

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::CLUFactor<double>::initFactorMatrix
          (CLUFactor<double> *this,SVectorBase<double> **vec,double eps)

{
  Col *pCVar1;
  double *pdVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  Nonzero<double> *pNVar7;
  Dring *pDVar8;
  SVectorBase<double> *pSVar9;
  int *piVar10;
  pointer pdVar11;
  int *piVar12;
  int i_1;
  Nonzero<double> *pNVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  long lVar17;
  Dring *pDVar18;
  long lVar19;
  long lVar20;
  Dring *pDVar21;
  int iVar22;
  int j;
  int iVar23;
  Dring *pDVar24;
  Dring *pDVar25;
  long lVar26;
  int i_3;
  int p_col;
  double dVar27;
  double dVar28;
  
  piVar4 = (this->temp).s_mark;
  piVar5 = (this->u).row.len;
  piVar6 = (this->u).row.max;
  for (lVar17 = 0; uVar16 = (ulong)this->thedim, lVar17 < (long)uVar16; lVar17 = lVar17 + 1) {
    piVar5[lVar17] = 0;
    piVar6[lVar17] = 0;
  }
  iVar23 = 0;
  for (lVar17 = 0; lVar17 < (int)uVar16; lVar17 = lVar17 + 1) {
    iVar22 = vec[lVar17]->memused;
    if ((long)iVar22 < 2) {
      if (iVar22 == 0) goto LAB_001d80d7;
    }
    else {
      piVar5 = (this->u).row.max;
      pNVar7 = vec[lVar17]->m_elem;
      for (lVar20 = 0; (long)iVar22 << 4 != lVar20; lVar20 = lVar20 + 0x10) {
        piVar6 = piVar5 + *(int *)((long)&pNVar7->idx + lVar20);
        *piVar6 = *piVar6 + 1;
      }
      iVar23 = iVar22 + iVar23;
      uVar16 = (ulong)(uint)this->thedim;
    }
  }
  dVar28 = (double)iVar23;
  minRowMem(this,(int)(this->rowMemMult * dVar28));
  minColMem(this,(int)(this->colMemMult * dVar28));
  minLMem(this,(int)(dVar28 * this->lMemMult));
  piVar5 = (this->u).row.start;
  *piVar5 = 0;
  pDVar8 = (this->u).row.elem;
  iVar23 = this->thedim;
  (this->u).row.list.idx = iVar23;
  (this->u).row.list.next = pDVar8;
  pCVar1 = &(this->u).col;
  pDVar25 = (this->u).col.elem;
  (this->u).col.list.idx = iVar23;
  (this->u).col.list.next = pDVar25;
  piVar6 = (this->u).row.max;
  iVar22 = 0;
  lVar17 = 0;
  pDVar21 = &pCVar1->list;
  pDVar24 = (Dring *)&this->u;
  for (; pDVar18 = pDVar8, lVar17 < iVar23; lVar17 = lVar17 + 1) {
    piVar5[lVar17] = iVar22;
    iVar22 = iVar22 + piVar6[lVar17];
    pDVar18->idx = (int)lVar17;
    pDVar18->prev = pDVar24;
    (((Row *)&pDVar24->next)->list).next = pDVar18;
    pDVar25->idx = (int)lVar17;
    pDVar25->prev = pDVar21;
    ((Dring *)&pDVar21->next)->next = pDVar25;
    iVar23 = this->thedim;
    pDVar8 = pDVar18 + 1;
    pDVar21 = pDVar25;
    pDVar24 = pDVar18;
    pDVar25 = pDVar25 + 1;
  }
  piVar5[iVar23] = 0;
  piVar6[this->thedim] = 0;
  (this->u).row.used = iVar22;
  pDVar24->next = (Dring *)&this->u;
  (this->u).row.list.prev = pDVar24;
  pDVar21->next = &pCVar1->list;
  (this->u).col.list.prev = pDVar21;
  (this->temp).stage = 0;
  this->initMaxabs = 0.0;
  lVar17 = 0;
  iVar23 = 0;
  do {
    if (this->thedim <= lVar17) {
      (this->u).col.used = iVar23;
      return;
    }
    pSVar9 = vec[lVar17];
    (this->u).col.start[lVar17] = iVar23;
    iVar22 = pSVar9->memused;
    lVar20 = 0;
    lVar19 = 0;
    for (uVar14 = 0; (lVar19 < iVar22 && (uVar14 < 2)); uVar14 = uVar14 + (eps < ABS(*pdVar2))) {
      pdVar2 = (double *)((long)&pSVar9->m_elem->val + lVar20);
      lVar19 = lVar19 + 1;
      lVar20 = lVar20 + 0x10;
    }
    p_col = (int)lVar17;
    if (uVar14 == 1) {
      pNVar7 = pSVar9->m_elem;
      do {
        pNVar13 = pNVar7;
        dVar28 = pNVar13->val;
        dVar27 = ABS(dVar28);
        pNVar7 = pNVar13 + 1;
      } while (dVar27 <= eps);
      iVar22 = pNVar13->idx;
      if (-1 < (this->row).perm[iVar22]) goto LAB_001d80d7;
      if (this->initMaxabs <= dVar27 && dVar27 != this->initMaxabs) {
        this->initMaxabs = dVar27;
      }
      setPivot(this,(this->temp).stage,p_col,iVar22,dVar28);
      piVar4[(this->temp).stage] = p_col;
      piVar5 = &(this->temp).stage;
      *piVar5 = *piVar5 + 1;
      iVar15 = 0;
    }
    else {
      if (uVar14 == 0) {
LAB_001d80d7:
        this->stat = SINGULAR;
        return;
      }
      piVar5 = (this->u).col.idx;
      piVar6 = (this->u).row.start;
      piVar10 = (this->u).row.len;
      pdVar11 = (this->u).row.val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar12 = (this->u).row.idx;
      lVar20 = 8;
      iVar15 = 0;
      for (lVar19 = 0; lVar19 < iVar22; lVar19 = lVar19 + 1) {
        dVar28 = *(double *)((long)pSVar9->m_elem + lVar20 + -8);
        dVar27 = ABS(dVar28);
        if (eps < dVar27) {
          iVar22 = *(int *)((long)&pSVar9->m_elem->val + lVar20);
          piVar5[iVar23] = iVar22;
          lVar26 = (long)piVar10[iVar22] + (long)piVar6[iVar22];
          piVar12[lVar26] = p_col;
          pdVar11[lVar26] = dVar28;
          piVar3 = piVar10 + iVar22;
          *piVar3 = *piVar3 + 1;
          if (this->initMaxabs <= dVar27 && dVar27 != this->initMaxabs) {
            this->initMaxabs = dVar27;
          }
          iVar23 = iVar23 + 1;
          iVar15 = iVar15 + 1;
          iVar22 = pSVar9->memused;
        }
        lVar20 = lVar20 + 0x10;
      }
    }
    (this->u).col.max[lVar17] = iVar15;
    (this->u).col.len[lVar17] = iVar15;
    (this->temp).s_cact[lVar17] = iVar15;
    lVar17 = lVar17 + 1;
  } while( true );
}

Assistant:

void CLUFactor<R>::initFactorMatrix(const SVectorBase<R>** vec, const R eps)
{

   R x;
   int m;
   int tot;
   Dring* rring, *lastrring;
   Dring* cring, *lastcring;
   const SVectorBase<R>* psv;
   int* sing = temp.s_mark;

   /*  Initialize:
    *  - column file thereby remembering column singletons in |sing|.
    *  - nonzeros counts per row
    *  - total number of nonzeros
    */

   for(int i = 0; i < thedim; i++)
      u.row.max[i] = u.row.len[i] = 0;

   tot = 0;

   for(int i = 0; i < thedim; i++)
   {
      int k;

      psv = vec[i];
      k = psv->size();

      if(k > 1)
      {
         tot += k;

         for(int j = 0; j < k; ++j)
            u.row.max[psv->index(j)]++;
      }
      else if(k == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }
   }

   /*  Resize nonzero memory if necessary
    */
   minRowMem(int(rowMemMult * tot));

   minColMem(int(colMemMult * tot));

   minLMem(int(lMemMult * tot));


   /*  Initialize:
    *  - row ring lists
    *  - row vectors in file
    *  - column ring lists
    */
   u.row.start[0] = 0;

   rring = u.row.elem;

   lastrring = &(u.row.list);

   lastrring->idx = thedim;

   lastrring->next = rring;

   cring = u.col.elem;

   lastcring = &(u.col.list);

   lastcring->idx = thedim;

   lastcring->next = cring;

   m = 0;

   for(int i = 0; i < thedim; i++)
   {
      u.row.start[i] = m;
      m += u.row.max[i];

      rring->idx = i;
      rring->prev = lastrring;
      lastrring->next = rring;
      lastrring = rring;
      ++rring;

      cring->idx = i;
      cring->prev = lastcring;
      lastcring->next = cring;
      lastcring = cring;
      ++cring;
   }

   u.row.start[thedim]       = 0;

   u.row.max[thedim]       = 0;
   u.row.used = m;

   lastrring->next = &(u.row.list);
   lastrring->next->prev = lastrring;

   lastcring->next = &(u.col.list);
   lastcring->next->prev = lastcring;

   /*  Copy matrix to row and column file
    *  excluding and marking column singletons!
    */
   m = 0;
   temp.stage = 0;

   initMaxabs = 0;

   for(int i = 0; i < thedim; i++)
   {
      int nnonzeros;

      psv = vec[i];
      u.col.start[i] = m;

      /* check whether number of nonzeros above tolerance is 0, 1 or >= 2 */
      nnonzeros = 0;

      for(int j = 0; j < psv->size() && nnonzeros <= 1; j++)
      {
         if(isNotZero(psv->value(j), eps))
            nnonzeros++;
      }

      /* basis is singular due to empty column */
      if(nnonzeros == 0)
      {
         this->stat = SLinSolver<R>::SINGULAR;
         return;
      }

      /* exclude column singletons */
      else if(nnonzeros == 1)
      {
         int j = 0;

         /* find nonzero */

         for(j = 0; isZero(psv->value(j), eps); j++)
            ;

         assert(j < psv->size());

         /* basis is singular due to two linearly dependent column singletons */
         if(row.perm[psv->index(j)] >= 0)
         {
            this->stat = SLinSolver<R>::SINGULAR;
            return;
         }

         /* update maximum absolute nonzero value */
         x = psv->value(j);

         if(spxAbs(x) > initMaxabs)
            initMaxabs = spxAbs(x);

         /* permute to front and mark as singleton */
         setPivot(temp.stage, i, psv->index(j), x);

         sing[temp.stage] = i;

         temp.stage++;

         /* set column length to zero */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = 0;
      }

      /* add to active matrix if not a column singleton */
      else
      {
         int end;
         int k;

         /* go through all nonzeros in column */
         assert(nnonzeros >= 2);
         nnonzeros = 0;

         for(int j = 0; j < psv->size(); j++)
         {
            x = psv->value(j);

            if(isNotZero(x, eps))
            {
               /* add to column array */
               k = psv->index(j);
               u.col.idx[m] = k;
               m++;

               /* add to row array */
               end = u.row.start[k] + u.row.len[k];
               u.row.idx[end] = i;
               u.row.val[end] = x;
               u.row.len[k]++;

               /* update maximum absolute nonzero value */

               if(spxAbs(x) > initMaxabs)
                  initMaxabs = spxAbs(x);

               nnonzeros++;
            }
         }

         assert(nnonzeros >= 2);

         /* set column length */
         temp.s_cact[i] = u.col.len[i] = u.col.max[i] = nnonzeros;
      }
   }

   u.col.used = m;
}